

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

bool Catch::TestCaseTracking::operator==(NameAndLocation *lhs,NameAndLocation *rhs)

{
  __type_conflict _Var1;
  bool bVar2;
  
  if ((lhs->location).line == (rhs->location).line) {
    _Var1 = std::operator==(&lhs->name,&rhs->name);
    if (_Var1) {
      bVar2 = SourceLineInfo::operator==(&lhs->location,&rhs->location);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool operator==(NameAndLocation const& lhs, NameAndLocation const& rhs) {
            // This is a very cheap check that should have a very high hit rate.
            // If we get to SourceLineInfo::operator==, we will redo it, but the
            // cost of repeating is trivial at that point (we will be paying
            // multiple strcmp/memcmps at that point).
            if ( lhs.location.line != rhs.location.line ) { return false; }
            return lhs.name == rhs.name && lhs.location == rhs.location;
        }